

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_ProString_&>,_QLatin1Char>
          *this)

{
  int iVar1;
  long lVar2;
  QString *pQVar3;
  ProString *pPVar4;
  CutResult CVar5;
  char16_t *pcVar6;
  char16_t *__src;
  long lVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (((this->a).a.a)->d).size;
  iVar1 = ((this->a).b)->m_length;
  lVar2 = (((this->a).a.b)->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,(long)iVar1 + lVar7 + lVar2 + 1,Uninitialized);
  pcVar8 = (__return_storage_ptr__->d).ptr;
  pQVar3 = (this->a).a.a;
  lVar7 = (pQVar3->d).size;
  if (lVar7 != 0) {
    pcVar6 = (pQVar3->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar8,pcVar6,lVar7 * 2);
  }
  pcVar8 = pcVar8 + lVar7;
  pQVar3 = (this->a).a.b;
  lVar7 = (pQVar3->d).size;
  if (lVar7 != 0) {
    pcVar6 = (pQVar3->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar8,pcVar6,lVar7 * 2);
  }
  pcVar8 = pcVar8 + lVar7;
  pPVar4 = (this->a).b;
  lVar7 = (long)pPVar4->m_length;
  if (lVar7 != 0) {
    pcVar6 = (pPVar4->m_string).d.ptr;
    local_40 = (long)pPVar4->m_offset;
    local_48 = lVar7;
    CVar5 = QtPrivate::QContainerImplHelper::mid((pPVar4->m_string).d.size,&local_40,&local_48);
    __src = (char16_t *)0x0;
    if (CVar5 != Null) {
      __src = pcVar6 + local_40;
    }
    memcpy(pcVar8,__src,lVar7 * 2);
    pcVar8 = pcVar8 + lVar7;
  }
  *pcVar8 = (ushort)(byte)(this->b).ch;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }